

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O2

void rw::xbox::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  Geometry *pGVar2;
  MeshHeader *pMVar3;
  uint32 uVar4;
  InstanceDataHeader *pIVar5;
  undefined8 uVar6;
  uint32 *minVert;
  long lVar7;
  MeshHeader *pMVar8;
  void *__dest;
  uint32 i;
  uint uVar9;
  
  pGVar2 = atomic->geometry;
  if (pGVar2->instData != (InstanceDataHeader *)0x0) {
    return;
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 205"
  ;
  pIVar5 = (InstanceDataHeader *)(*DAT_00145dd8)(0x40,0x3000f);
  pMVar3 = pGVar2->meshHeader;
  pGVar2->instData = pIVar5;
  pIVar5->platform = 5;
  uVar1 = pMVar3->numMeshes;
  uVar4 = (uint)uVar1 * 0x18 + 0x34;
  pIVar5[1].platform = uVar4;
  pMVar8 = pMVar3 + 1;
  for (lVar7 = 0; (uint)uVar1 * 0x18 != (int)lVar7; lVar7 = lVar7 + 0x18) {
    uVar4 = uVar4 + (*(int *)((long)&pMVar3[1].totalIndices + lVar7) * 2 + 0xfU & 0xfffffff0);
    pIVar5[1].platform = uVar4;
  }
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 216"
  ;
  uVar6 = (*DAT_00145dd8)((long)(int)(uVar4 + 0x18),0x3000f);
  *(undefined8 *)(pIVar5 + 0xe) = uVar6;
  *(uint16 *)&pIVar5[2].platform = pMVar3->serialNum;
  uVar1 = pMVar3->numMeshes;
  *(ushort *)((long)&pIVar5[2].platform + 2) = uVar1;
  pIVar5[3].platform = (pMVar3->flags == 1) + 5;
  pIVar5[4].platform = pGVar2->numVertices;
  *(undefined8 *)(pIVar5 + 5) = 0;
  *(undefined8 *)(pIVar5 + 7) = 0;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/xbox.cpp line: 227"
  ;
  minVert = (uint32 *)(*DAT_00145dd8)((ulong)uVar1 * 0x28,0x3000f);
  *(uint32 **)(pIVar5 + 10) = minVert;
  uVar1 = *(ushort *)((long)&pIVar5[2].platform + 2);
  __dest = (void *)((ulong)((uint)uVar1 * 0x18 + 0x4b & 0xfffffff0) + *(long *)(pIVar5 + 0xe));
  for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 1) {
    findMinVertAndNumVertices
              (*(uint16 **)pMVar8,pMVar8->totalIndices,minVert,(int32 *)(minVert + 1));
    uVar4 = pMVar8->totalIndices;
    minVert[2] = uVar4;
    *(void **)(minVert + 4) = __dest;
    memcpy(__dest,*(void **)pMVar8,(long)(int)uVar4 * 2);
    __dest = (void *)((long)__dest + ((long)(int)minVert[2] * 2 + 0xfU & 0xfffffffffffffff0));
    *(undefined8 *)(minVert + 6) = *(undefined8 *)(pMVar8 + 1);
    minVert[8] = 0;
    pMVar8 = (MeshHeader *)&pMVar8[1].totalIndices;
    minVert = minVert + 10;
    uVar1 = *(ushort *)((long)&pIVar5[2].platform + 2);
  }
  *(uint32 **)(pIVar5 + 0xc) = minVert;
  (**(code **)&rwpipe[1].super_Pipeline)(pGVar2,pIVar5);
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, xbox can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	geo->instData = header;
	header->platform = PLATFORM_XBOX;

	header->size = 0x24 + meshh->numMeshes*0x18 + 0x10;
	Mesh *mesh = meshh->getMeshes();
	for(uint32 i = 0; i < meshh->numMeshes; i++)
		header->size += (mesh++->numIndices*2 + 0xF) & ~0xF;
	// The 0x18 byte are the resentryheader.
	// We don't have it but it's used for alignment.
	header->data = rwNewT(uint8, header->size + 0x18, MEMDUR_EVENT | ID_GEOMETRY);
	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->primType = meshh->flags == MeshHeader::TRISTRIP ?
		D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
	header->numVertices = geo->numVertices;
	header->vertexAlpha = 0;
	// set by the instanceCB
	header->stride = 0;
	header->vertexBuffer = nil;

	InstanceData *inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);
	header->begin = inst;
	mesh = meshh->getMeshes();
	uint8 *indexbuf = (uint8*)header->data + ((0x18 + 0x24 + header->numMeshes*0x18 + 0xF)&~0xF);
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, &inst->numVertices);
		inst->numIndices = mesh->numIndices;
		inst->indexBuffer = indexbuf;
		memcpy(inst->indexBuffer, mesh->indices, inst->numIndices*sizeof(uint16));
		indexbuf += (inst->numIndices*2 + 0xF) & ~0xF;
		inst->material = mesh->material;
		inst->vertexShader = 0;	// TODO?
		mesh++;
		inst++;
	}
	header->end = inst;

	pipe->instanceCB(geo, header);
}